

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined4 uVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  float fVar27;
  float fVar36;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  float fVar37;
  float fVar43;
  float fVar44;
  undefined1 auVar38 [16];
  float fVar45;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar68;
  float fVar70;
  undefined1 auVar59 [16];
  float fVar73;
  undefined1 auVar60 [16];
  float fVar69;
  float fVar71;
  float fVar74;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar72;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar75;
  float fVar79;
  float fVar80;
  undefined1 auVar76 [16];
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [16];
  float fVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  float fVar95;
  float fVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  undefined1 auVar103 [64];
  undefined1 auVar108 [16];
  float fVar107;
  float fVar120;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [64];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar130 [64];
  undefined1 auVar134 [64];
  float fVar135;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  float fVar141;
  float fVar146;
  undefined1 auVar142 [16];
  float fVar144;
  float fVar145;
  undefined1 auVar143 [64];
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27a9;
  ulong local_27a8;
  undefined8 local_27a0;
  float fStack_2798;
  float fStack_2794;
  undefined8 local_2790;
  float fStack_2788;
  float fStack_2784;
  long local_2780;
  float fStack_2778;
  float fStack_2774;
  undefined1 local_2770 [16];
  size_t local_2758;
  RayHitK<4> *local_2750;
  long local_2748;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  Scene *local_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [16];
  undefined1 (*local_26f0) [16];
  long local_26e8;
  ulong local_26e0;
  ulong local_26d8;
  RTCFilterFunctionNArguments local_26d0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [16];
  undefined1 *local_2670;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [2] [16];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  RTCHitN local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar14 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar13;
  local_23c0._0_4_ = uVar13;
  local_23c0._8_4_ = uVar13;
  local_23c0._12_4_ = uVar13;
  local_23c0._16_4_ = uVar13;
  local_23c0._20_4_ = uVar13;
  local_23c0._24_4_ = uVar13;
  local_23c0._28_4_ = uVar13;
  auVar94 = ZEXT3264(local_23c0);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar13;
  local_23e0._0_4_ = uVar13;
  local_23e0._8_4_ = uVar13;
  local_23e0._12_4_ = uVar13;
  local_23e0._16_4_ = uVar13;
  local_23e0._20_4_ = uVar13;
  local_23e0._24_4_ = uVar13;
  local_23e0._28_4_ = uVar13;
  auVar103 = ZEXT3264(local_23e0);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar13;
  local_2400._0_4_ = uVar13;
  local_2400._8_4_ = uVar13;
  local_2400._12_4_ = uVar13;
  local_2400._16_4_ = uVar13;
  local_2400._20_4_ = uVar13;
  local_2400._24_4_ = uVar13;
  local_2400._28_4_ = uVar13;
  auVar117 = ZEXT3264(local_2400);
  fVar27 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar37 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar36 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar28 = ZEXT416((uint)(fVar27 * 0.99999964));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_2420._16_16_ = auVar28;
  local_2420._0_16_ = auVar28;
  auVar123 = ZEXT3264(local_2420);
  auVar28 = ZEXT416((uint)(fVar37 * 0.99999964));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_2440._16_16_ = auVar28;
  local_2440._0_16_ = auVar28;
  auVar125 = ZEXT3264(local_2440);
  auVar28 = ZEXT416((uint)(fVar36 * 0.99999964));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_2460._16_16_ = auVar28;
  local_2460._0_16_ = auVar28;
  auVar130 = ZEXT3264(local_2460);
  auVar28 = ZEXT416((uint)(fVar27 * 1.0000004));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_2480._16_16_ = auVar28;
  local_2480._0_16_ = auVar28;
  auVar134 = ZEXT3264(local_2480);
  auVar28 = ZEXT416((uint)(fVar37 * 1.0000004));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_24a0._16_16_ = auVar28;
  local_24a0._0_16_ = auVar28;
  auVar137 = ZEXT3264(local_24a0);
  auVar28 = ZEXT416((uint)(fVar36 * 1.0000004));
  auVar28 = vshufps_avx(auVar28,auVar28,0);
  local_24c0._16_16_ = auVar28;
  local_24c0._0_16_ = auVar28;
  auVar143 = ZEXT3264(local_24c0);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_26d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_26e0 = uVar21 ^ 0x20;
  uVar26 = local_26d8 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_25e0._4_4_ = iVar1;
  local_25e0._0_4_ = iVar1;
  local_25e0._8_4_ = iVar1;
  local_25e0._12_4_ = iVar1;
  local_25e0._16_4_ = iVar1;
  local_25e0._20_4_ = iVar1;
  local_25e0._24_4_ = iVar1;
  local_25e0._28_4_ = iVar1;
  auVar149 = ZEXT3264(local_25e0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar35 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_26f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_2750 = ray;
  local_2758 = k;
  local_27a8 = uVar21;
LAB_003ef7c6:
  do {
    pauVar25 = pauVar14 + -1;
    pauVar14 = pauVar14 + -1;
    if (*(float *)(*pauVar25 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar19 = *(ulong *)*pauVar14;
      while ((uVar19 & 8) == 0) {
        auVar93 = auVar94._0_32_;
        auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar21),auVar93);
        auVar8._4_4_ = auVar123._4_4_ * auVar7._4_4_;
        auVar8._0_4_ = auVar123._0_4_ * auVar7._0_4_;
        auVar8._8_4_ = auVar123._8_4_ * auVar7._8_4_;
        auVar8._12_4_ = auVar123._12_4_ * auVar7._12_4_;
        auVar8._16_4_ = auVar123._16_4_ * auVar7._16_4_;
        auVar8._20_4_ = auVar123._20_4_ * auVar7._20_4_;
        auVar8._24_4_ = auVar123._24_4_ * auVar7._24_4_;
        auVar8._28_4_ = auVar7._28_4_;
        auVar102 = auVar103._0_32_;
        auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_26d8),auVar102);
        auVar116._4_4_ = auVar125._4_4_ * auVar7._4_4_;
        auVar116._0_4_ = auVar125._0_4_ * auVar7._0_4_;
        auVar116._8_4_ = auVar125._8_4_ * auVar7._8_4_;
        auVar116._12_4_ = auVar125._12_4_ * auVar7._12_4_;
        auVar116._16_4_ = auVar125._16_4_ * auVar7._16_4_;
        auVar116._20_4_ = auVar125._20_4_ * auVar7._20_4_;
        auVar116._24_4_ = auVar125._24_4_ * auVar7._24_4_;
        auVar116._28_4_ = auVar7._28_4_;
        auVar7 = vmaxps_avx(auVar8,auVar116);
        auVar116 = auVar117._0_32_;
        auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar24),auVar116);
        auVar9._4_4_ = auVar130._4_4_ * auVar8._4_4_;
        auVar9._0_4_ = auVar130._0_4_ * auVar8._0_4_;
        auVar9._8_4_ = auVar130._8_4_ * auVar8._8_4_;
        auVar9._12_4_ = auVar130._12_4_ * auVar8._12_4_;
        auVar9._16_4_ = auVar130._16_4_ * auVar8._16_4_;
        auVar9._20_4_ = auVar130._20_4_ * auVar8._20_4_;
        auVar9._24_4_ = auVar130._24_4_ * auVar8._24_4_;
        auVar9._28_4_ = auVar8._28_4_;
        auVar8 = vmaxps_avx(auVar9,auVar149._0_32_);
        local_26a0 = vmaxps_avx(auVar7,auVar8);
        auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + local_26e0),auVar93);
        auVar10._4_4_ = auVar134._4_4_ * auVar7._4_4_;
        auVar10._0_4_ = auVar134._0_4_ * auVar7._0_4_;
        auVar10._8_4_ = auVar134._8_4_ * auVar7._8_4_;
        auVar10._12_4_ = auVar134._12_4_ * auVar7._12_4_;
        auVar10._16_4_ = auVar134._16_4_ * auVar7._16_4_;
        auVar10._20_4_ = auVar134._20_4_ * auVar7._20_4_;
        auVar10._24_4_ = auVar134._24_4_ * auVar7._24_4_;
        auVar10._28_4_ = auVar7._28_4_;
        auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar26),auVar102);
        auVar11._4_4_ = auVar137._4_4_ * auVar7._4_4_;
        auVar11._0_4_ = auVar137._0_4_ * auVar7._0_4_;
        auVar11._8_4_ = auVar137._8_4_ * auVar7._8_4_;
        auVar11._12_4_ = auVar137._12_4_ * auVar7._12_4_;
        auVar11._16_4_ = auVar137._16_4_ * auVar7._16_4_;
        auVar11._20_4_ = auVar137._20_4_ * auVar7._20_4_;
        auVar11._24_4_ = auVar137._24_4_ * auVar7._24_4_;
        auVar11._28_4_ = auVar7._28_4_;
        auVar7 = vminps_avx(auVar10,auVar11);
        auVar8 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar24 ^ 0x20)),auVar116);
        auVar12._4_4_ = auVar143._4_4_ * auVar8._4_4_;
        auVar12._0_4_ = auVar143._0_4_ * auVar8._0_4_;
        auVar12._8_4_ = auVar143._8_4_ * auVar8._8_4_;
        auVar12._12_4_ = auVar143._12_4_ * auVar8._12_4_;
        auVar12._16_4_ = auVar143._16_4_ * auVar8._16_4_;
        auVar12._20_4_ = auVar143._20_4_ * auVar8._20_4_;
        auVar12._24_4_ = auVar143._24_4_ * auVar8._24_4_;
        auVar12._28_4_ = auVar8._28_4_;
        auVar8 = vminps_avx(auVar12,auVar35._0_32_);
        auVar7 = vminps_avx(auVar7,auVar8);
        auVar7 = vcmpps_avx(local_26a0,auVar7,2);
        uVar15 = vmovmskps_avx(auVar7);
        if (uVar15 == 0) {
          if (pauVar14 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_003ef7c6;
        }
        uVar15 = uVar15 & 0xff;
        uVar22 = uVar19 & 0xfffffffffffffff0;
        lVar23 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
          }
        }
        uVar19 = *(ulong *)(uVar22 + lVar23 * 8);
        uVar15 = uVar15 - 1 & uVar15;
        if (uVar15 != 0) {
          uVar3 = *(uint *)(local_26a0 + lVar23 * 4);
          lVar23 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar16 = *(ulong *)(uVar22 + lVar23 * 8);
          uVar4 = *(uint *)(local_26a0 + lVar23 * 4);
          uVar15 = uVar15 - 1 & uVar15;
          uVar21 = local_27a8;
          if (uVar15 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar14 = uVar16;
              *(uint *)(*pauVar14 + 8) = uVar4;
              pauVar14 = pauVar14 + 1;
            }
            else {
              *(ulong *)*pauVar14 = uVar19;
              *(uint *)(*pauVar14 + 8) = uVar3;
              pauVar14 = pauVar14 + 1;
              uVar19 = uVar16;
            }
          }
          else {
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar19;
            auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar3));
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar16;
            auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar4));
            lVar23 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)(uVar22 + lVar23 * 8);
            auVar38 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_26a0 + lVar23 * 4)));
            auVar59 = vpcmpgtd_avx(auVar46,auVar28);
            uVar15 = uVar15 - 1 & uVar15;
            if (uVar15 == 0) {
              auVar83 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar46,auVar28,auVar83);
              auVar28 = vblendvps_avx(auVar28,auVar46,auVar83);
              auVar46 = vpcmpgtd_avx(auVar38,auVar59);
              auVar83 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar38,auVar59,auVar83);
              auVar59 = vblendvps_avx(auVar59,auVar38,auVar83);
              auVar38 = vpcmpgtd_avx(auVar59,auVar28);
              auVar83 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar59,auVar28,auVar83);
              auVar28 = vblendvps_avx(auVar28,auVar59,auVar83);
              *pauVar14 = auVar28;
              pauVar14[1] = auVar38;
              uVar19 = auVar46._0_8_;
              pauVar14 = pauVar14 + 2;
            }
            else {
              lVar23 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *(ulong *)(uVar22 + lVar23 * 8);
              auVar83 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_26a0 + lVar23 * 4)));
              uVar15 = uVar15 - 1 & uVar15;
              uVar16 = (ulong)uVar15;
              if (uVar15 == 0) {
                auVar29 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar46,auVar28,auVar29);
                auVar28 = vblendvps_avx(auVar28,auVar46,auVar29);
                auVar46 = vpcmpgtd_avx(auVar83,auVar38);
                auVar29 = vpshufd_avx(auVar46,0xaa);
                auVar46 = vblendvps_avx(auVar83,auVar38,auVar29);
                auVar38 = vblendvps_avx(auVar38,auVar83,auVar29);
                auVar83 = vpcmpgtd_avx(auVar38,auVar28);
                auVar29 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar38,auVar28,auVar29);
                auVar28 = vblendvps_avx(auVar28,auVar38,auVar29);
                auVar38 = vpcmpgtd_avx(auVar46,auVar59);
                auVar29 = vpshufd_avx(auVar38,0xaa);
                auVar38 = vblendvps_avx(auVar46,auVar59,auVar29);
                auVar46 = vblendvps_avx(auVar59,auVar46,auVar29);
                auVar59 = vpcmpgtd_avx(auVar83,auVar46);
                auVar29 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar83,auVar46,auVar29);
                auVar46 = vblendvps_avx(auVar46,auVar83,auVar29);
                *pauVar14 = auVar28;
                pauVar14[1] = auVar46;
                pauVar14[2] = auVar59;
                uVar19 = auVar38._0_8_;
                pauVar25 = pauVar14 + 3;
              }
              else {
                *pauVar14 = auVar28;
                pauVar14[1] = auVar46;
                pauVar14[2] = auVar38;
                pauVar14[3] = auVar83;
                lVar23 = 0x30;
                do {
                  lVar18 = lVar23;
                  lVar23 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  uVar19 = *(ulong *)(uVar22 + lVar23 * 8);
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar19;
                  auVar28 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_26a0 + lVar23 * 4)));
                  *(undefined1 (*) [16])(pauVar14[1] + lVar18) = auVar28;
                  uVar16 = uVar16 & uVar16 - 1;
                  lVar23 = lVar18 + 0x10;
                } while (uVar16 != 0);
                pauVar25 = (undefined1 (*) [16])(pauVar14[1] + lVar18);
                if (lVar18 + 0x10 != 0) {
                  lVar23 = 0x10;
                  pauVar17 = pauVar14;
                  do {
                    auVar28 = pauVar17[1];
                    pauVar17 = pauVar17 + 1;
                    uVar15 = vextractps_avx(auVar28,2);
                    lVar18 = lVar23;
                    do {
                      if (uVar15 <= *(uint *)(pauVar14[-1] + lVar18 + 8)) {
                        pauVar20 = (undefined1 (*) [16])(*pauVar14 + lVar18);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar14 + lVar18) =
                           *(undefined1 (*) [16])(pauVar14[-1] + lVar18);
                      lVar18 = lVar18 + -0x10;
                      pauVar20 = pauVar14;
                    } while (lVar18 != 0);
                    *pauVar20 = auVar28;
                    lVar23 = lVar23 + 0x10;
                  } while (pauVar25 != pauVar17);
                  uVar19 = *(ulong *)*pauVar25;
                }
              }
              auVar94 = ZEXT3264(auVar93);
              auVar103 = ZEXT3264(auVar102);
              auVar117 = ZEXT3264(auVar116);
              auVar123 = ZEXT3264(auVar123._0_32_);
              auVar125 = ZEXT3264(auVar125._0_32_);
              auVar130 = ZEXT3264(auVar130._0_32_);
              auVar134 = ZEXT3264(auVar134._0_32_);
              auVar137 = ZEXT3264(auVar137._0_32_);
              auVar143 = ZEXT3264(auVar143._0_32_);
              auVar149 = ZEXT3264(local_25e0);
              pauVar14 = pauVar25;
            }
          }
        }
      }
      local_26e8 = (ulong)((uint)uVar19 & 0xf) - 8;
      if (local_26e8 != 0) {
        uVar19 = uVar19 & 0xfffffffffffffff0;
        lVar23 = 0;
        do {
          lVar18 = lVar23 * 0xb0;
          uVar13 = *(undefined4 *)(ray + k * 4);
          auVar29._4_4_ = uVar13;
          auVar29._0_4_ = uVar13;
          auVar29._8_4_ = uVar13;
          auVar29._12_4_ = uVar13;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar47._4_4_ = uVar13;
          auVar47._0_4_ = uVar13;
          auVar47._8_4_ = uVar13;
          auVar47._12_4_ = uVar13;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar76._4_4_ = uVar13;
          auVar76._0_4_ = uVar13;
          auVar76._8_4_ = uVar13;
          auVar76._12_4_ = uVar13;
          local_2720 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + lVar18),auVar29);
          auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar18),auVar47);
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar18),auVar76);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x30 + lVar18),auVar29);
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x40 + lVar18),auVar47);
          auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x50 + lVar18),auVar76);
          auVar29 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x60 + lVar18),auVar29);
          auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x70 + lVar18),auVar47);
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x80 + lVar18),auVar76);
          local_2560 = vsubps_avx(auVar29,local_2720);
          local_2570 = vsubps_avx(auVar47,auVar28);
          local_2580 = vsubps_avx(auVar76,auVar46);
          fVar56 = auVar28._0_4_;
          fVar37 = fVar56 + auVar47._0_4_;
          fVar68 = auVar28._4_4_;
          fVar43 = fVar68 + auVar47._4_4_;
          fVar70 = auVar28._8_4_;
          fVar44 = fVar70 + auVar47._8_4_;
          fVar73 = auVar28._12_4_;
          fVar45 = fVar73 + auVar47._12_4_;
          fVar141 = auVar46._0_4_;
          fVar75 = fVar141 + auVar76._0_4_;
          fVar144 = auVar46._4_4_;
          fVar79 = fVar144 + auVar76._4_4_;
          fVar145 = auVar46._8_4_;
          fVar80 = fVar145 + auVar76._8_4_;
          fVar146 = auVar46._12_4_;
          fVar81 = fVar146 + auVar76._12_4_;
          fVar27 = local_2580._0_4_;
          auVar108._0_4_ = fVar37 * fVar27;
          fVar36 = local_2580._4_4_;
          auVar108._4_4_ = fVar43 * fVar36;
          fVar58 = local_2580._8_4_;
          auVar108._8_4_ = fVar44 * fVar58;
          fVar72 = local_2580._12_4_;
          auVar108._12_4_ = fVar45 * fVar72;
          fVar147 = local_2570._0_4_;
          auVar121._0_4_ = fVar147 * fVar75;
          fVar150 = local_2570._4_4_;
          auVar121._4_4_ = fVar150 * fVar79;
          fVar152 = local_2570._8_4_;
          auVar121._8_4_ = fVar152 * fVar80;
          fVar154 = local_2570._12_4_;
          auVar121._12_4_ = fVar154 * fVar81;
          auVar31 = vsubps_avx(auVar121,auVar108);
          fVar95 = local_2720._0_4_;
          fVar107 = fVar95 + auVar29._0_4_;
          fVar104 = local_2720._4_4_;
          fVar118 = fVar104 + auVar29._4_4_;
          fVar105 = local_2720._8_4_;
          fVar119 = fVar105 + auVar29._8_4_;
          fVar106 = local_2720._12_4_;
          fVar120 = fVar106 + auVar29._12_4_;
          fVar124 = local_2560._0_4_;
          auVar77._0_4_ = fVar124 * fVar75;
          fVar126 = local_2560._4_4_;
          auVar77._4_4_ = fVar126 * fVar79;
          fVar127 = local_2560._8_4_;
          auVar77._8_4_ = fVar127 * fVar80;
          fVar128 = local_2560._12_4_;
          auVar77._12_4_ = fVar128 * fVar81;
          auVar122._0_4_ = fVar107 * fVar27;
          auVar122._4_4_ = fVar118 * fVar36;
          auVar122._8_4_ = fVar119 * fVar58;
          auVar122._12_4_ = fVar120 * fVar72;
          auVar48 = vsubps_avx(auVar122,auVar77);
          auVar109._0_4_ = fVar107 * fVar147;
          auVar109._4_4_ = fVar118 * fVar150;
          auVar109._8_4_ = fVar119 * fVar152;
          auVar109._12_4_ = fVar120 * fVar154;
          auVar30._0_4_ = fVar124 * fVar37;
          auVar30._4_4_ = fVar126 * fVar43;
          auVar30._8_4_ = fVar127 * fVar44;
          auVar30._12_4_ = fVar128 * fVar45;
          auVar30 = vsubps_avx(auVar30,auVar109);
          local_2790._4_4_ = *(float *)(ray + k * 4 + 0x60);
          fStack_2778 = *(float *)(ray + k * 4 + 0x50);
          local_27a0._4_4_ = *(float *)(ray + k * 4 + 0x40);
          local_25a0._0_4_ =
               auVar31._0_4_ * local_27a0._4_4_ +
               local_2790._4_4_ * auVar30._0_4_ + fStack_2778 * auVar48._0_4_;
          local_25a0._4_4_ =
               auVar31._4_4_ * local_27a0._4_4_ +
               local_2790._4_4_ * auVar30._4_4_ + fStack_2778 * auVar48._4_4_;
          local_25a0._8_4_ =
               auVar31._8_4_ * local_27a0._4_4_ +
               local_2790._4_4_ * auVar30._8_4_ + fStack_2778 * auVar48._8_4_;
          local_25a0._12_4_ =
               auVar31._12_4_ * local_27a0._4_4_ +
               local_2790._4_4_ * auVar30._12_4_ + fStack_2778 * auVar48._12_4_;
          local_2590 = vsubps_avx(auVar28,auVar38);
          auVar28 = vsubps_avx(auVar46,auVar83);
          fVar37 = auVar38._0_4_ + fVar56;
          fVar43 = auVar38._4_4_ + fVar68;
          fVar44 = auVar38._8_4_ + fVar70;
          fVar45 = auVar38._12_4_ + fVar73;
          fVar75 = fVar141 + auVar83._0_4_;
          fVar79 = fVar144 + auVar83._4_4_;
          fVar80 = fVar145 + auVar83._8_4_;
          fVar81 = fVar146 + auVar83._12_4_;
          fVar148 = auVar28._0_4_;
          auVar142._0_4_ = fVar148 * fVar37;
          fVar151 = auVar28._4_4_;
          auVar142._4_4_ = fVar151 * fVar43;
          fVar153 = auVar28._8_4_;
          auVar142._8_4_ = fVar153 * fVar44;
          fVar155 = auVar28._12_4_;
          auVar142._12_4_ = fVar155 * fVar45;
          fVar135 = local_2590._0_4_;
          auVar60._0_4_ = fVar135 * fVar75;
          fVar138 = local_2590._4_4_;
          auVar60._4_4_ = fVar138 * fVar79;
          fVar139 = local_2590._8_4_;
          auVar60._8_4_ = fVar139 * fVar80;
          fVar140 = local_2590._12_4_;
          auVar60._12_4_ = fVar140 * fVar81;
          auVar28 = vsubps_avx(auVar60,auVar142);
          auVar46 = vsubps_avx(local_2720,auVar59);
          fVar129 = auVar46._0_4_;
          auVar78._0_4_ = fVar129 * fVar75;
          fVar131 = auVar46._4_4_;
          auVar78._4_4_ = fVar131 * fVar79;
          fVar132 = auVar46._8_4_;
          auVar78._8_4_ = fVar132 * fVar80;
          fVar133 = auVar46._12_4_;
          auVar78._12_4_ = fVar133 * fVar81;
          fVar75 = auVar59._0_4_ + fVar95;
          fVar79 = auVar59._4_4_ + fVar104;
          fVar80 = auVar59._8_4_ + fVar105;
          fVar81 = auVar59._12_4_ + fVar106;
          auVar110._0_4_ = fVar148 * fVar75;
          auVar110._4_4_ = fVar151 * fVar79;
          auVar110._8_4_ = fVar153 * fVar80;
          auVar110._12_4_ = fVar155 * fVar81;
          auVar46 = vsubps_avx(auVar110,auVar78);
          auVar96._0_4_ = fVar135 * fVar75;
          auVar96._4_4_ = fVar138 * fVar79;
          auVar96._8_4_ = fVar139 * fVar80;
          auVar96._12_4_ = fVar140 * fVar81;
          auVar31._0_4_ = fVar129 * fVar37;
          auVar31._4_4_ = fVar131 * fVar43;
          auVar31._8_4_ = fVar132 * fVar44;
          auVar31._12_4_ = fVar133 * fVar45;
          auVar31 = vsubps_avx(auVar31,auVar96);
          local_25b0._0_4_ =
               local_27a0._4_4_ * auVar28._0_4_ +
               local_2790._4_4_ * auVar31._0_4_ + fStack_2778 * auVar46._0_4_;
          local_25b0._4_4_ =
               local_27a0._4_4_ * auVar28._4_4_ +
               local_2790._4_4_ * auVar31._4_4_ + fStack_2778 * auVar46._4_4_;
          local_25b0._8_4_ =
               local_27a0._4_4_ * auVar28._8_4_ +
               local_2790._4_4_ * auVar31._8_4_ + fStack_2778 * auVar46._8_4_;
          local_25b0._12_4_ =
               local_27a0._4_4_ * auVar28._12_4_ +
               local_2790._4_4_ * auVar31._12_4_ + fStack_2778 * auVar46._12_4_;
          auVar28 = vsubps_avx(auVar59,auVar29);
          fVar57 = auVar59._0_4_ + auVar29._0_4_;
          fVar69 = auVar59._4_4_ + auVar29._4_4_;
          fVar71 = auVar59._8_4_ + auVar29._8_4_;
          fVar74 = auVar59._12_4_ + auVar29._12_4_;
          auVar46 = vsubps_avx(auVar38,auVar47);
          fVar82 = auVar38._0_4_ + auVar47._0_4_;
          fVar88 = auVar38._4_4_ + auVar47._4_4_;
          fVar89 = auVar38._8_4_ + auVar47._8_4_;
          fVar90 = auVar38._12_4_ + auVar47._12_4_;
          auVar59 = vsubps_avx(auVar83,auVar76);
          fVar107 = auVar83._0_4_ + auVar76._0_4_;
          fVar118 = auVar83._4_4_ + auVar76._4_4_;
          fVar119 = auVar83._8_4_ + auVar76._8_4_;
          fVar120 = auVar83._12_4_ + auVar76._12_4_;
          fVar37 = auVar59._0_4_;
          auVar97._0_4_ = fVar82 * fVar37;
          fVar43 = auVar59._4_4_;
          auVar97._4_4_ = fVar88 * fVar43;
          fVar44 = auVar59._8_4_;
          auVar97._8_4_ = fVar89 * fVar44;
          fVar45 = auVar59._12_4_;
          auVar97._12_4_ = fVar90 * fVar45;
          fVar75 = auVar46._0_4_;
          auVar111._0_4_ = fVar75 * fVar107;
          fVar79 = auVar46._4_4_;
          auVar111._4_4_ = fVar79 * fVar118;
          fVar80 = auVar46._8_4_;
          auVar111._8_4_ = fVar80 * fVar119;
          fVar81 = auVar46._12_4_;
          auVar111._12_4_ = fVar81 * fVar120;
          auVar46 = vsubps_avx(auVar111,auVar97);
          fVar136 = auVar28._0_4_;
          auVar48._0_4_ = fVar136 * fVar107;
          fVar107 = auVar28._4_4_;
          auVar48._4_4_ = fVar107 * fVar118;
          fVar118 = auVar28._8_4_;
          auVar48._8_4_ = fVar118 * fVar119;
          fVar119 = auVar28._12_4_;
          auVar48._12_4_ = fVar119 * fVar120;
          auVar112._0_4_ = fVar57 * fVar37;
          auVar112._4_4_ = fVar69 * fVar43;
          auVar112._8_4_ = fVar71 * fVar44;
          auVar112._12_4_ = fVar74 * fVar45;
          auVar28 = vsubps_avx(auVar112,auVar48);
          auVar61._0_4_ = fVar57 * fVar75;
          auVar61._4_4_ = fVar69 * fVar79;
          auVar61._8_4_ = fVar71 * fVar80;
          auVar61._12_4_ = fVar74 * fVar81;
          auVar84._0_4_ = fVar136 * fVar82;
          auVar84._4_4_ = fVar107 * fVar88;
          auVar84._8_4_ = fVar118 * fVar89;
          auVar84._12_4_ = fVar119 * fVar90;
          auVar59 = vsubps_avx(auVar84,auVar61);
          local_2790._0_4_ = local_2790._4_4_;
          fStack_2788 = local_2790._4_4_;
          fStack_2784 = local_2790._4_4_;
          local_27a0._0_4_ = local_27a0._4_4_;
          fStack_2798 = local_27a0._4_4_;
          fStack_2794 = local_27a0._4_4_;
          auVar49._0_4_ =
               local_27a0._4_4_ * auVar46._0_4_ +
               local_2790._4_4_ * auVar59._0_4_ + fStack_2778 * auVar28._0_4_;
          auVar49._4_4_ =
               local_27a0._4_4_ * auVar46._4_4_ +
               local_2790._4_4_ * auVar59._4_4_ + fStack_2778 * auVar28._4_4_;
          auVar49._8_4_ =
               local_27a0._4_4_ * auVar46._8_4_ +
               local_2790._4_4_ * auVar59._8_4_ + fStack_2778 * auVar28._8_4_;
          auVar49._12_4_ =
               local_27a0._4_4_ * auVar46._12_4_ +
               local_2790._4_4_ * auVar59._12_4_ + fStack_2778 * auVar28._12_4_;
          local_2680._0_4_ = auVar49._0_4_ + local_25a0._0_4_ + local_25b0._0_4_;
          local_2680._4_4_ = auVar49._4_4_ + local_25a0._4_4_ + local_25b0._4_4_;
          local_2680._8_4_ = auVar49._8_4_ + local_25a0._8_4_ + local_25b0._8_4_;
          local_2680._12_4_ = auVar49._12_4_ + local_25a0._12_4_ + local_25b0._12_4_;
          auVar28 = vminps_avx(local_25a0,local_25b0);
          auVar28 = vminps_avx(auVar28,auVar49);
          auVar85._8_4_ = 0x7fffffff;
          auVar85._0_8_ = 0x7fffffff7fffffff;
          auVar85._12_4_ = 0x7fffffff;
          local_25c0 = vandps_avx(local_2680,auVar85);
          auVar86._0_4_ = local_25c0._0_4_ * 1.1920929e-07;
          auVar86._4_4_ = local_25c0._4_4_ * 1.1920929e-07;
          auVar86._8_4_ = local_25c0._8_4_ * 1.1920929e-07;
          auVar86._12_4_ = local_25c0._12_4_ * 1.1920929e-07;
          uVar22 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
          auVar98._0_8_ = uVar22 ^ 0x8000000080000000;
          auVar98._8_4_ = -auVar86._8_4_;
          auVar98._12_4_ = -auVar86._12_4_;
          auVar28 = vcmpps_avx(auVar28,auVar98,5);
          auVar46 = vmaxps_avx(local_25a0,local_25b0);
          auVar46 = vmaxps_avx(auVar46,auVar49);
          auVar46 = vcmpps_avx(auVar46,auVar86,2);
          auVar28 = vorps_avx(auVar28,auVar46);
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            auVar50._0_4_ = fVar135 * fVar27;
            auVar50._4_4_ = fVar138 * fVar36;
            auVar50._8_4_ = fVar139 * fVar58;
            auVar50._12_4_ = fVar140 * fVar72;
            auVar62._0_4_ = fVar148 * fVar147;
            auVar62._4_4_ = fVar151 * fVar150;
            auVar62._8_4_ = fVar153 * fVar152;
            auVar62._12_4_ = fVar155 * fVar154;
            auVar38 = vsubps_avx(auVar62,auVar50);
            auVar87._0_4_ = fVar148 * fVar75;
            auVar87._4_4_ = fVar151 * fVar79;
            auVar87._8_4_ = fVar153 * fVar80;
            auVar87._12_4_ = fVar155 * fVar81;
            auVar99._0_4_ = fVar135 * fVar37;
            auVar99._4_4_ = fVar138 * fVar43;
            auVar99._8_4_ = fVar139 * fVar44;
            auVar99._12_4_ = fVar140 * fVar45;
            auVar83 = vsubps_avx(auVar99,auVar87);
            auVar113._8_4_ = 0x7fffffff;
            auVar113._0_8_ = 0x7fffffff7fffffff;
            auVar113._12_4_ = 0x7fffffff;
            auVar46 = vandps_avx(auVar113,auVar50);
            auVar59 = vandps_avx(auVar113,auVar87);
            auVar46 = vcmpps_avx(auVar46,auVar59,1);
            local_2620 = vblendvps_avx(auVar83,auVar38,auVar46);
            auVar51._0_4_ = fVar129 * fVar37;
            auVar51._4_4_ = fVar131 * fVar43;
            auVar51._8_4_ = fVar132 * fVar44;
            auVar51._12_4_ = fVar133 * fVar45;
            auVar63._0_4_ = fVar129 * fVar27;
            auVar63._4_4_ = fVar131 * fVar36;
            auVar63._8_4_ = fVar132 * fVar58;
            auVar63._12_4_ = fVar133 * fVar72;
            auVar91._0_4_ = fVar148 * fVar124;
            auVar91._4_4_ = fVar151 * fVar126;
            auVar91._8_4_ = fVar153 * fVar127;
            auVar91._12_4_ = fVar155 * fVar128;
            auVar38 = vsubps_avx(auVar63,auVar91);
            auVar100._0_4_ = fVar148 * fVar136;
            auVar100._4_4_ = fVar151 * fVar107;
            auVar100._8_4_ = fVar153 * fVar118;
            auVar100._12_4_ = fVar155 * fVar119;
            auVar83 = vsubps_avx(auVar100,auVar51);
            auVar46 = vandps_avx(auVar113,auVar91);
            auVar59 = vandps_avx(auVar113,auVar51);
            auVar46 = vcmpps_avx(auVar46,auVar59,1);
            local_2610 = vblendvps_avx(auVar83,auVar38,auVar46);
            auVar32._0_4_ = fVar135 * fVar136;
            auVar32._4_4_ = fVar138 * fVar107;
            auVar32._8_4_ = fVar139 * fVar118;
            auVar32._12_4_ = fVar140 * fVar119;
            auVar64._0_4_ = fVar135 * fVar124;
            auVar64._4_4_ = fVar138 * fVar126;
            auVar64._8_4_ = fVar139 * fVar127;
            auVar64._12_4_ = fVar140 * fVar128;
            auVar92._0_4_ = fVar129 * fVar147;
            auVar92._4_4_ = fVar131 * fVar150;
            auVar92._8_4_ = fVar132 * fVar152;
            auVar92._12_4_ = fVar133 * fVar154;
            auVar39._0_4_ = fVar129 * fVar75;
            auVar39._4_4_ = fVar131 * fVar79;
            auVar39._8_4_ = fVar132 * fVar80;
            auVar39._12_4_ = fVar133 * fVar81;
            auVar38 = vsubps_avx(auVar64,auVar92);
            auVar83 = vsubps_avx(auVar39,auVar32);
            auVar46 = vandps_avx(auVar113,auVar92);
            auVar59 = vandps_avx(auVar113,auVar32);
            auVar46 = vcmpps_avx(auVar46,auVar59,1);
            local_2600[0] = vblendvps_avx(auVar83,auVar38,auVar46);
            fVar27 = local_2620._0_4_ * local_27a0._4_4_ +
                     local_2600[0]._0_4_ * local_2790._4_4_ + fStack_2778 * local_2610._0_4_;
            fVar37 = local_2620._4_4_ * local_27a0._4_4_ +
                     local_2600[0]._4_4_ * local_2790._4_4_ + fStack_2778 * local_2610._4_4_;
            fVar36 = local_2620._8_4_ * local_27a0._4_4_ +
                     local_2600[0]._8_4_ * local_2790._4_4_ + fStack_2778 * local_2610._8_4_;
            fVar43 = local_2620._12_4_ * local_27a0._4_4_ +
                     local_2600[0]._12_4_ * local_2790._4_4_ + fStack_2778 * local_2610._12_4_;
            auVar33._0_4_ = fVar27 + fVar27;
            auVar33._4_4_ = fVar37 + fVar37;
            auVar33._8_4_ = fVar36 + fVar36;
            auVar33._12_4_ = fVar43 + fVar43;
            fVar58 = local_2620._0_4_ * fVar95 +
                     local_2600[0]._0_4_ * fVar141 + local_2610._0_4_ * fVar56;
            fVar44 = local_2620._4_4_ * fVar104 +
                     local_2600[0]._4_4_ * fVar144 + local_2610._4_4_ * fVar68;
            fVar72 = local_2620._8_4_ * fVar105 +
                     local_2600[0]._8_4_ * fVar145 + local_2610._8_4_ * fVar70;
            fVar45 = local_2620._12_4_ * fVar106 +
                     local_2600[0]._12_4_ * fVar146 + local_2610._12_4_ * fVar73;
            auVar46 = vrcpps_avx(auVar33);
            fVar27 = auVar46._0_4_;
            auVar101._0_4_ = auVar33._0_4_ * fVar27;
            fVar37 = auVar46._4_4_;
            auVar101._4_4_ = auVar33._4_4_ * fVar37;
            fVar36 = auVar46._8_4_;
            auVar101._8_4_ = auVar33._8_4_ * fVar36;
            fVar43 = auVar46._12_4_;
            auVar101._12_4_ = auVar33._12_4_ * fVar43;
            auVar114._8_4_ = 0x3f800000;
            auVar114._0_8_ = 0x3f8000003f800000;
            auVar114._12_4_ = 0x3f800000;
            auVar46 = vsubps_avx(auVar114,auVar101);
            local_2630._0_4_ = (fVar58 + fVar58) * (fVar27 + fVar27 * auVar46._0_4_);
            local_2630._4_4_ = (fVar44 + fVar44) * (fVar37 + fVar37 * auVar46._4_4_);
            local_2630._8_4_ = (fVar72 + fVar72) * (fVar36 + fVar36 * auVar46._8_4_);
            local_2630._12_4_ = (fVar45 + fVar45) * (fVar43 + fVar43 * auVar46._12_4_);
            auVar94 = ZEXT1664(local_2630);
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar65._4_4_ = uVar13;
            auVar65._0_4_ = uVar13;
            auVar65._8_4_ = uVar13;
            auVar65._12_4_ = uVar13;
            auVar46 = vcmpps_avx(auVar65,local_2630,2);
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar115._4_4_ = uVar13;
            auVar115._0_4_ = uVar13;
            auVar115._8_4_ = uVar13;
            auVar115._12_4_ = uVar13;
            auVar103 = ZEXT1664(auVar115);
            auVar59 = vcmpps_avx(local_2630,auVar115,2);
            auVar46 = vandps_avx(auVar59,auVar46);
            auVar59 = auVar28 & auVar46;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              auVar28 = vandps_avx(auVar28,auVar46);
              auVar46 = vcmpps_avx(auVar33,_DAT_01f7aa10,4);
              auVar59 = auVar46 & auVar28;
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                local_2770 = vandps_avx(auVar28,auVar46);
                local_26a0._16_16_ = local_25b0;
                local_26a0._0_16_ = local_25a0;
                local_2670 = &local_27a9;
                local_2660 = local_2770;
                uStack_2708 = auVar76._8_8_;
                local_2710 = context->scene;
                auVar28 = vrcpps_avx(local_2680);
                fVar27 = auVar28._0_4_;
                auVar52._0_4_ = local_2680._0_4_ * fVar27;
                fVar37 = auVar28._4_4_;
                auVar52._4_4_ = local_2680._4_4_ * fVar37;
                fVar36 = auVar28._8_4_;
                auVar52._8_4_ = local_2680._8_4_ * fVar36;
                fVar43 = auVar28._12_4_;
                auVar52._12_4_ = local_2680._12_4_ * fVar43;
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = 0x3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar28 = vsubps_avx(auVar66,auVar52);
                auVar40._0_4_ = fVar27 + fVar27 * auVar28._0_4_;
                auVar40._4_4_ = fVar37 + fVar37 * auVar28._4_4_;
                auVar40._8_4_ = fVar36 + fVar36 * auVar28._8_4_;
                auVar40._12_4_ = fVar43 + fVar43 * auVar28._12_4_;
                auVar53._8_4_ = 0x219392ef;
                auVar53._0_8_ = 0x219392ef219392ef;
                auVar53._12_4_ = 0x219392ef;
                auVar28 = vcmpps_avx(local_25c0,auVar53,5);
                auVar28 = vandps_avx(auVar28,auVar40);
                auVar54._0_4_ = local_25a0._0_4_ * auVar28._0_4_;
                auVar54._4_4_ = local_25a0._4_4_ * auVar28._4_4_;
                auVar54._8_4_ = local_25a0._8_4_ * auVar28._8_4_;
                auVar54._12_4_ = local_25a0._12_4_ * auVar28._12_4_;
                local_2650 = vminps_avx(auVar54,auVar66);
                auVar41._0_4_ = local_25b0._0_4_ * auVar28._0_4_;
                auVar41._4_4_ = local_25b0._4_4_ * auVar28._4_4_;
                auVar41._8_4_ = local_25b0._8_4_ * auVar28._8_4_;
                auVar41._12_4_ = local_25b0._12_4_ * auVar28._12_4_;
                local_2640 = vminps_avx(auVar41,auVar66);
                auVar55._8_4_ = 0x7f800000;
                auVar55._0_8_ = 0x7f8000007f800000;
                auVar55._12_4_ = 0x7f800000;
                auVar28 = vblendvps_avx(auVar55,local_2630,local_2770);
                auVar46 = vshufps_avx(auVar28,auVar28,0xb1);
                auVar46 = vminps_avx(auVar46,auVar28);
                auVar59 = vshufpd_avx(auVar46,auVar46,1);
                auVar46 = vminps_avx(auVar59,auVar46);
                auVar28 = vcmpps_avx(auVar28,auVar46,0);
                auVar59 = local_2770 & auVar28;
                auVar46 = vpcmpeqd_avx(auVar46,auVar46);
                if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar59[0xf] < '\0') {
                  auVar46 = auVar28;
                }
                auVar28 = vandps_avx(local_2770,auVar46);
                uVar13 = vmovmskps_avx(auVar28);
                uVar22 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar13);
                local_2780 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> local_2780 & 1) == 0; local_2780 = local_2780 + 1) {
                  }
                }
                local_27a0 = lVar18 + uVar19;
                lVar18 = lVar18 + uVar19;
                fStack_2774 = fStack_2778;
LAB_003f00f5:
                uVar15 = *(uint *)(lVar18 + 0x90 + local_2780 * 4);
                lVar18 = *(long *)(*(long *)((long)local_2710 + 0x1e8) + (ulong)uVar15 * 8);
                local_2790 = lVar18;
                if ((*(uint *)(lVar18 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2770 + local_2780 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (*(long *)(lVar18 + 0x40) == 0)) {
                    uVar13 = *(undefined4 *)(local_2650 + local_2780 * 4);
                    uVar2 = *(undefined4 *)(local_2640 + local_2780 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_2630 + local_2780 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) =
                         *(undefined4 *)(local_2620 + local_2780 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) =
                         *(undefined4 *)(local_2610 + local_2780 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) =
                         *(undefined4 *)(local_2600[0] + local_2780 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar13;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(local_27a0 + 0xa0 + local_2780 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar15;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_003f0583;
                  }
                  uVar13 = *(undefined4 *)(local_2650 + local_2780 * 4);
                  local_2520._4_4_ = uVar13;
                  local_2520._0_4_ = uVar13;
                  local_2520._8_4_ = uVar13;
                  local_2520._12_4_ = uVar13;
                  local_2510 = *(undefined4 *)(local_2640 + local_2780 * 4);
                  pRVar5 = context->user;
                  local_2720._0_8_ = pRVar5;
                  local_24f0 = vpshufd_avx(ZEXT416(uVar15),0);
                  uVar13 = *(undefined4 *)(local_27a0 + 0xa0 + local_2780 * 4);
                  auVar67._4_4_ = uVar13;
                  auVar67._0_4_ = uVar13;
                  auVar67._8_4_ = uVar13;
                  auVar67._12_4_ = uVar13;
                  uVar13 = *(undefined4 *)(local_2620 + local_2780 * 4);
                  uVar2 = *(undefined4 *)(local_2610 + local_2780 * 4);
                  local_2540._4_4_ = uVar2;
                  local_2540._0_4_ = uVar2;
                  local_2540._8_4_ = uVar2;
                  local_2540._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_2600[0] + local_2780 * 4);
                  local_2530._4_4_ = uVar2;
                  local_2530._0_4_ = uVar2;
                  local_2530._8_4_ = uVar2;
                  local_2530._12_4_ = uVar2;
                  local_2550[0] = (RTCHitN)(char)uVar13;
                  local_2550[1] = (RTCHitN)(char)((uint)uVar13 >> 8);
                  local_2550[2] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                  local_2550[3] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                  local_2550[4] = (RTCHitN)(char)uVar13;
                  local_2550[5] = (RTCHitN)(char)((uint)uVar13 >> 8);
                  local_2550[6] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                  local_2550[7] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                  local_2550[8] = (RTCHitN)(char)uVar13;
                  local_2550[9] = (RTCHitN)(char)((uint)uVar13 >> 8);
                  local_2550[10] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                  local_2550[0xb] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                  local_2550[0xc] = (RTCHitN)(char)uVar13;
                  local_2550[0xd] = (RTCHitN)(char)((uint)uVar13 >> 8);
                  local_2550[0xe] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                  local_2550[0xf] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                  uStack_250c = local_2510;
                  uStack_2508 = local_2510;
                  uStack_2504 = local_2510;
                  local_2500 = auVar67;
                  vcmpps_avx(ZEXT1632(local_2520),ZEXT1632(local_2520),0xf);
                  uStack_24dc = pRVar5->instID[0];
                  local_24e0 = uStack_24dc;
                  uStack_24d8 = uStack_24dc;
                  uStack_24d4 = uStack_24dc;
                  uStack_24d0 = pRVar5->instPrimID[0];
                  uStack_24cc = uStack_24d0;
                  uStack_24c8 = uStack_24d0;
                  uStack_24c4 = uStack_24d0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + local_2780 * 4)
                  ;
                  local_2700 = *local_26f0;
                  local_26d0.valid = (int *)local_2700;
                  local_26d0.geometryUserPtr = *(void **)(lVar18 + 0x18);
                  local_26d0.context = context->user;
                  local_26d0.hit = local_2550;
                  local_26d0.N = 4;
                  local_2730 = auVar94._0_16_;
                  local_2740 = auVar103._0_16_;
                  local_2748 = lVar23;
                  local_26d0.ray = (RTCRayN *)ray;
                  if (*(code **)(lVar18 + 0x40) != (code *)0x0) {
                    (**(code **)(lVar18 + 0x40))(&local_26d0);
                    auVar103 = ZEXT1664(local_2740);
                    auVar94 = ZEXT1664(local_2730);
                    k = local_2758;
                    ray = local_2750;
                    uVar21 = local_27a8;
                  }
                  if (local_2700 == (undefined1  [16])0x0) {
                    auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar28 = auVar28 ^ _DAT_01f7ae20;
                    lVar23 = local_2748;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_2790 + 0x3e) & 0x40) != 0)))) {
                      (*p_Var6)(&local_26d0);
                      auVar103 = ZEXT1664(local_2740);
                      auVar94 = ZEXT1664(local_2730);
                      k = local_2758;
                      ray = local_2750;
                      uVar21 = local_27a8;
                    }
                    auVar46 = vpcmpeqd_avx(local_2700,_DAT_01f7aa10);
                    auVar59 = vpcmpeqd_avx(auVar67,auVar67);
                    auVar28 = auVar46 ^ auVar59;
                    lVar23 = local_2748;
                    if (local_2700 != (undefined1  [16])0x0) {
                      auVar46 = auVar46 ^ auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])local_26d0.hit);
                      *(undefined1 (*) [16])(local_26d0.ray + 0xc0) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0xd0) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0xe0) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0xf0) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0x100) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0x110) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0x120) = auVar59;
                      auVar59 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0x130) = auVar59;
                      auVar46 = vmaskmovps_avx(auVar46,*(undefined1 (*) [16])(local_26d0.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_26d0.ray + 0x140) = auVar46;
                    }
                  }
                  auVar34._8_8_ = 0x100000001;
                  auVar34._0_8_ = 0x100000001;
                  if ((auVar34 & auVar28) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar103._0_4_;
                  }
                  else {
                    auVar103 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_2770 + local_2780 * 4) = 0;
                  auVar28 = vshufps_avx(auVar103._0_16_,auVar103._0_16_,0);
                  auVar28 = vcmpps_avx(auVar94._0_16_,auVar28,2);
                  local_2770 = vandps_avx(auVar28,local_2770);
                }
                if ((((local_2770 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2770 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2770 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2770[0xf]) goto LAB_003f0583;
                auVar42._8_4_ = 0x7f800000;
                auVar42._0_8_ = 0x7f8000007f800000;
                auVar42._12_4_ = 0x7f800000;
                auVar28 = vblendvps_avx(auVar42,auVar94._0_16_,local_2770);
                auVar46 = vshufps_avx(auVar28,auVar28,0xb1);
                auVar46 = vminps_avx(auVar46,auVar28);
                auVar59 = vshufpd_avx(auVar46,auVar46,1);
                auVar46 = vminps_avx(auVar59,auVar46);
                auVar46 = vcmpps_avx(auVar28,auVar46,0);
                auVar59 = local_2770 & auVar46;
                auVar28 = local_2770;
                if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar59[0xf] < '\0') {
                  auVar28 = vandps_avx(auVar46,local_2770);
                }
                uVar13 = vmovmskps_avx(auVar28);
                uVar22 = CONCAT44((int)((ulong)local_2780 >> 0x20),uVar13);
                local_2780 = 0;
                lVar18 = local_27a0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> local_2780 & 1) == 0; local_2780 = local_2780 + 1) {
                  }
                }
                goto LAB_003f00f5;
              }
            }
          }
LAB_003f0583:
          lVar23 = lVar23 + 1;
        } while (lVar23 != local_26e8);
      }
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,
                                                  CONCAT412(uVar13,CONCAT48(uVar13,CONCAT44(uVar13,
                                                  uVar13))))))));
      auVar94 = ZEXT3264(local_23c0);
      auVar103 = ZEXT3264(local_23e0);
      auVar117 = ZEXT3264(local_2400);
      auVar123 = ZEXT3264(local_2420);
      auVar125 = ZEXT3264(local_2440);
      auVar130 = ZEXT3264(local_2460);
      auVar134 = ZEXT3264(local_2480);
      auVar137 = ZEXT3264(local_24a0);
      auVar143 = ZEXT3264(local_24c0);
      auVar149 = ZEXT3264(local_25e0);
    }
    if (pauVar14 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }